

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

NullableValue<kj::HttpClient::WebSocketResponse> * __thiscall
kj::_::NullableValue<kj::HttpClient::WebSocketResponse>::operator=
          (NullableValue<kj::HttpClient::WebSocketResponse> *this,
          NullableValue<kj::HttpClient::WebSocketResponse> *other)

{
  WebSocketResponse *params;
  NullableValue<kj::HttpClient::WebSocketResponse> *other_local;
  NullableValue<kj::HttpClient::WebSocketResponse> *this_local;
  
  if (other != this) {
    if ((this->isSet & 1U) != 0) {
      this->isSet = false;
      dtor<kj::HttpClient::WebSocketResponse>(&(this->field_1).value);
    }
    if ((other->isSet & 1U) != 0) {
      params = mv<kj::HttpClient::WebSocketResponse>(&(other->field_1).value);
      ctor<kj::HttpClient::WebSocketResponse,kj::HttpClient::WebSocketResponse>
                (&(this->field_1).value,params);
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }